

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_hal.cpp
# Opt level: O3

MPP_RET mpp_hal_init(MppHal *ctx,MppHalCfg *cfg)

{
  undefined8 *puVar1;
  MPP_RET MVar2;
  uint uVar3;
  undefined8 *ptr;
  void *pvVar4;
  long lVar5;
  
  if (ctx == (MppHal *)0x0 || cfg == (MppHalCfg *)0x0) {
    _mpp_log_l(2,"mpp_hal","found NULL input ctx %p cfg %p\n","mpp_hal_init",ctx,cfg);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (MppHal)0x0;
    ptr = (undefined8 *)mpp_osal_calloc("mpp_hal_init",0x18);
    if (ptr == (undefined8 *)0x0) {
      _mpp_log_l(2,"mpp_hal","malloc failed\n","mpp_hal_init");
      MVar2 = MPP_ERR_MALLOC;
    }
    else {
      lVar5 = 0;
      do {
        puVar1 = *(undefined8 **)((long)hw_apis + lVar5);
        if ((cfg->type == *(MppCtxType *)(puVar1 + 1)) &&
           (cfg->coding == *(MppCodingType *)((long)puVar1 + 0xc))) {
          ptr[1] = puVar1;
          pvVar4 = mpp_osal_calloc("mpp_hal_init",(ulong)*(uint *)(puVar1 + 2));
          *ptr = pvVar4;
          uVar3 = (**(code **)(ptr[1] + 0x18))(pvVar4,cfg);
          if (uVar3 == 0) {
            *ctx = ptr;
            return MPP_OK;
          }
          _mpp_log_l(2,"mpp_hal","hal %s init failed ret %d\n","mpp_hal_init",*puVar1,(ulong)uVar3);
          break;
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x70);
      _mpp_log_l(2,"mpp_hal","could not found coding type %d\n","mpp_hal_init",(ulong)cfg->coding);
      mpp_osal_free("mpp_hal_init",(void *)*ptr);
      mpp_osal_free("mpp_hal_init",ptr);
      MVar2 = MPP_NOK;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_hal_init(MppHal *ctx, MppHalCfg *cfg)
{
    if (NULL == ctx || NULL == cfg) {
        mpp_err_f("found NULL input ctx %p cfg %p\n", ctx, cfg);
        return MPP_ERR_NULL_PTR;
    }
    *ctx = NULL;

    MppHalImpl *p = mpp_calloc(MppHalImpl, 1);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_MALLOC;
    }

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(hw_apis); i++) {
        if (cfg->type   == hw_apis[i]->type &&
            cfg->coding == hw_apis[i]->coding) {
            p->api  = hw_apis[i];
            p->ctx  = mpp_calloc_size(void, p->api->ctx_size);

            MPP_RET ret = p->api->init(p->ctx, cfg);
            if (ret) {
                mpp_err_f("hal %s init failed ret %d\n", hw_apis[i]->name, ret);
                break;
            }

            *ctx = p;
            return MPP_OK;
        }
    }

    mpp_err_f("could not found coding type %d\n", cfg->coding);
    mpp_free(p->ctx);
    mpp_free(p);

    return MPP_NOK;
}